

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,StructSchema schema)

{
  StructSchema SVar1;
  uint uVar2;
  uint uVar3;
  Schema local_60;
  StructSchema schema_local;
  Fault f;
  void *local_40;
  uint local_30;
  
  schema_local = schema;
  Schema::getProto((Reader *)&f,&schema_local.super_Schema);
  SVar1 = schema_local;
  if ((0xe0 < local_30) &&
     (local_60.raw = (RawBrandedSchema *)
                     (CONCAT71(local_60.raw._1_7_,*(byte *)((long)local_40 + 0x1c)) &
                      0xffffffffffffff01 ^ 1), (*(byte *)((long)local_40 + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x776,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",
               (DebugExpression<bool> *)&local_60,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  local_60 = schema_local.super_Schema.raw;
  Schema::getProto((Reader *)&f,&local_60);
  uVar2 = 0;
  if (local_30 < 0x80) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)*(ushort *)((long)local_40 + 0xe);
    if (0xcf < local_30) {
      uVar2 = (uint)*(ushort *)((long)local_40 + 0x18) << 0x10;
    }
  }
  PointerBuilder::getStruct
            (&__return_storage_ptr__->builder,&builder,(StructSize)(uVar3 | uVar2),(word *)0x0);
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)SVar1.super_Schema.raw;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}